

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl_fileutils.c
# Opt level: O0

int mctools_path_is_absolute(mcu8str *rawpath)

{
  char cVar1;
  char *path_begin;
  mcu8str path;
  mcu8str *in_stack_ffffffffffffffd0;
  mcu8str *in_stack_ffffffffffffffd8;
  uint local_20;
  int local_4;
  
  mctools_impl_view_no_winnamespace(in_stack_ffffffffffffffd0);
  if (local_20 == 0) {
    local_4 = 0;
  }
  else if (((local_20 < 2) || (*(char *)&in_stack_ffffffffffffffd8->c_str != '~')) ||
          ((*(char *)((long)&in_stack_ffffffffffffffd8->c_str + 1) != '/' &&
           (*(char *)((long)&in_stack_ffffffffffffffd8->c_str + 1) != '\\')))) {
    cVar1 = mctools_drive_letter(in_stack_ffffffffffffffd8);
    if (cVar1 != '\0') {
      in_stack_ffffffffffffffd8 = (mcu8str *)((long)&in_stack_ffffffffffffffd8->c_str + 2);
    }
    if ((*(char *)&in_stack_ffffffffffffffd8->c_str == '/') ||
       (*(char *)&in_stack_ffffffffffffffd8->c_str == '\\')) {
      local_4 = 1;
    }
    else {
      local_4 = 0;
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int mctools_path_is_absolute( const mcu8str* rawpath )
  {
    mcu8str path = mctools_impl_view_no_winnamespace(rawpath);
    if ( path.size == 0 )
      return 0;
    if ( path.size >= 2
         && path.c_str[0] == '~'
         && ( path.c_str[1] == '/' || path.c_str[1] == '\\' ) )
      return 1;//leading "~/"
    const char * path_begin = path.c_str;
    if ( mctools_drive_letter( &path ) )
      path_begin += 2;
    if ( *path_begin == '/' || *path_begin == '\\' )
      return 1;
    return 0;
  }